

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O3

bool __thiscall DIS::ServiceRequestPdu::operator==(ServiceRequestPdu *this,ServiceRequestPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pSVar4;
  ulong uVar5;
  long lVar6;
  
  bVar1 = LogisticsFamilyPdu::operator==
                    (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar2 = EntityID::operator==(&this->_requestingEntityID,&rhs->_requestingEntityID);
  bVar3 = EntityID::operator==(&this->_servicingEntityID,&rhs->_servicingEntityID);
  bVar1 = this->_serviceRequestPadding == rhs->_serviceRequestPadding &&
          (this->_serviceTypeRequested == rhs->_serviceTypeRequested && (bVar3 && (bVar2 && bVar1)))
  ;
  pSVar4 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_supplies).
      super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      bVar2 = SupplyQuantity::operator==
                        ((SupplyQuantity *)((long)&pSVar4->_vptr_SupplyQuantity + lVar6),
                         (SupplyQuantity *)
                         ((long)&((rhs->_supplies).
                                  super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_SupplyQuantity +
                         lVar6));
      bVar1 = (bool)(bVar1 & bVar2);
      uVar5 = uVar5 + 1;
      pSVar4 = (this->_supplies).
               super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)((long)(this->_supplies).
                                   super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5));
  }
  return bVar1;
}

Assistant:

bool ServiceRequestPdu::operator ==(const ServiceRequestPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_requestingEntityID == rhs._requestingEntityID) ) ivarsEqual = false;
     if( ! (_servicingEntityID == rhs._servicingEntityID) ) ivarsEqual = false;
     if( ! (_serviceTypeRequested == rhs._serviceTypeRequested) ) ivarsEqual = false;
     if( ! (_serviceRequestPadding == rhs._serviceRequestPadding) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _supplies.size(); idx++)
     {
        if( ! ( _supplies[idx] == rhs._supplies[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }